

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# wrap.cpp
# Opt level: O2

ssize_t C_std::Write(int fd,void *buf,size_t count)

{
  ssize_t sVar1;
  int *piVar2;
  allocator local_41;
  string local_40;
  
  do {
    sVar1 = write(fd,buf,count);
    if (-1 < (int)sVar1) goto LAB_00103aff;
    piVar2 = __errno_location();
  } while ((*piVar2 == 4) || (*piVar2 == 0xb));
  std::__cxx11::string::string((string *)&local_40,"write error",&local_41);
  perror_exit(&local_40);
  std::__cxx11::string::~string((string *)&local_40);
LAB_00103aff:
  return (long)(int)sVar1;
}

Assistant:

ssize_t Write(int fd, const void *buf, size_t count) {
        AGAIN:
        int n = write(fd, buf, count);
        if (n < 0) {
            //出错处理
            if (errno == EAGAIN || errno == EWOULDBLOCK) {
                goto AGAIN;
            } else if (errno == EINTR) {
                //慢速系统调用，如果被注册捕捉函数的信号中断则重新读取
                goto AGAIN;
            } else {
                perror_exit("write error");
            }
        }
        return n;
    }